

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void vdbeMergeEngineFree(MergeEngine *pMerger)

{
  long lVar1;
  long lVar2;
  
  if (pMerger != (MergeEngine *)0x0) {
    lVar1 = 0;
    for (lVar2 = 0; lVar2 < pMerger->nTree; lVar2 = lVar2 + 1) {
      vdbePmaReaderClear((PmaReader *)((long)&pMerger->aReadr->iReadOff + lVar1));
      lVar1 = lVar1 + 0x50;
    }
  }
  sqlite3_free(pMerger);
  return;
}

Assistant:

static void vdbeMergeEngineFree(MergeEngine *pMerger){
  int i;
  if( pMerger ){
    for(i=0; i<pMerger->nTree; i++){
      vdbePmaReaderClear(&pMerger->aReadr[i]);
    }
  }
  sqlite3_free(pMerger);
}